

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

Object * __thiscall flatbuffers::BinaryAnnotator::RootTable(BinaryAnnotator *this)

{
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  return_type pOVar1;
  Object *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if ((this->root_table_)._M_string_length != 0) {
    this_00 = reflection::Schema::objects(this->schema_);
    std::__cxx11::string::string((string *)&bStack_38,(string *)&this->root_table_);
    pOVar1 = Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
             LookupByKey<std::__cxx11::string>
                       ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)this_00,
                        &bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
    return pOVar1;
  }
  pOVar2 = reflection::Schema::root_table(this->schema_);
  return pOVar2;
}

Assistant:

const reflection::Object *BinaryAnnotator::RootTable() const {
  if (!root_table_.empty()) {
    return schema_->objects()->LookupByKey(root_table_);
  }
  return schema_->root_table();
}